

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Slow(CodedInputStream *this,uint64_t *value)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  lVar5 = 0;
  uVar4 = 0;
  do {
    bVar6 = lVar5 != 10;
    if (lVar5 == 10) {
      uVar4 = 0;
      break;
    }
    while (pbVar2 = this->buffer_, pbVar2 == this->buffer_end_) {
      bVar3 = Refresh(this);
      if (!bVar3) {
        uVar4 = 0;
        bVar6 = false;
        goto LAB_00366fd0;
      }
    }
    bVar1 = *pbVar2;
    uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << ((char)lVar5 * '\a' & 0x3fU);
    this->buffer_ = pbVar2 + 1;
    lVar5 = lVar5 + 1;
  } while ((char)bVar1 < '\0');
LAB_00366fd0:
  *value = uVar4;
  return bVar6;
}

Assistant:

bool CodedInputStream::ReadVarint64Slow(uint64_t* value) {
  // Slow path:  This read might cross the end of the buffer, so we
  // need to check and refresh the buffer if and when it does.

  uint64_t result = 0;
  int count = 0;
  uint32_t b;

  do {
    if (count == kMaxVarintBytes) {
      *value = 0;
      return false;
    }
    while (buffer_ == buffer_end_) {
      if (!Refresh()) {
        *value = 0;
        return false;
      }
    }
    b = *buffer_;
    result |= static_cast<uint64_t>(b & 0x7F) << (7 * count);
    Advance(1);
    ++count;
  } while (b & 0x80);

  *value = result;
  return true;
}